

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2MatchNumberPeculiarity(void)

{
  bool bVar1;
  int iVar2;
  string word1;
  string a;
  string word3;
  string word2;
  Arg *args [1];
  RE2 r;
  Arg local_338;
  StringPiece local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  undefined8 local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  LogMessage local_298;
  Arg *local_118;
  RE2 local_110;
  
  RE2::RE2(&local_110,"(foo)|(bar)|(baz)");
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_2e8.field_2._8_8_ = 0;
  local_2c8[0] = 0;
  local_298._0_8_ = "foo";
  local_298._8_4_ = 3;
  local_2f8 = &local_318;
  local_328.ptr_ = (char *)&local_2b8;
  local_338.arg_ = &local_2e8.field_2;
  local_2e8.field_2._M_allocated_capacity = (size_type)local_2c8;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    ((StringPiece *)&local_298,&local_110,&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_328,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_338);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x145,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),
               "Check failed: RE2::PartialMatch(\"foo\", r, &word1, &word2, &word3)",0x41);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_318);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x146,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (word1) == (\"foo\")",0x20);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_2b8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x147,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (word2) == (\"\")",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare(local_2e8.field_2._M_local_buf);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x148,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (word3) == (\"\")",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  local_298._0_8_ = "bar";
  local_298._8_4_ = 3;
  local_338.arg_ = &local_2e8.field_2;
  local_328.ptr_ = (char *)&local_2b8;
  local_2f8 = &local_318;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    ((StringPiece *)&local_298,&local_110,&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_328,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_338);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x149,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),
               "Check failed: RE2::PartialMatch(\"bar\", r, &word1, &word2, &word3)",0x41);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_318);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14a,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (word1) == (\"\")",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_2b8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (word2) == (\"bar\")",0x20);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare(local_2e8.field_2._M_local_buf);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (word3) == (\"\")",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  local_298._0_8_ = "baz";
  local_298._8_4_ = 3;
  local_338.arg_ = &local_2e8.field_2;
  local_328.ptr_ = (char *)&local_2b8;
  local_2f8 = &local_318;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    ((StringPiece *)&local_298,&local_110,&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_328,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_338);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),
               "Check failed: RE2::PartialMatch(\"baz\", r, &word1, &word2, &word3)",0x41);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_318);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (word1) == (\"\")",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_2b8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (word2) == (\"\")",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare(local_2e8.field_2._M_local_buf);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x150,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (word3) == (\"baz\")",0x20);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  local_298._0_8_ = "f";
  local_298._8_4_ = 1;
  local_338.arg_ = &local_2e8.field_2;
  local_328.ptr_ = (char *)&local_2b8;
  local_2f8 = &local_318;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    ((StringPiece *)&local_298,&local_110,&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_328,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_338);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x151,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),
               "Check failed: !RE2::PartialMatch(\"f\", r, &word1, &word2, &word3)",0x40);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  local_2f0 = 0;
  local_2e8._M_dataplus._M_p._0_1_ = 0;
  local_2f8 = &local_2e8;
  RE2::RE2((RE2 *)&local_298,"(foo)|hello");
  local_338.parser_ = RE2::Arg::parse_string;
  local_328.ptr_ = "hello";
  local_328.length_ = 5;
  local_338.arg_ = &local_2f8;
  local_118 = &local_338;
  bVar1 = RE2::FullMatchN(&local_328,(RE2 *)&local_298,&local_118,1);
  RE2::~RE2((RE2 *)&local_298);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x154,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),
               "Check failed: RE2::FullMatch(\"hello\", \"(foo)|hello\", &a)",0x38);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_2f8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x155,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_298 + 8),"Check failed: (a) == (\"\")",0x19);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  if ((undefined1 *)local_2e8.field_2._M_allocated_capacity != local_2c8) {
    operator_delete((void *)local_2e8.field_2._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  RE2::~RE2(&local_110);
  return;
}

Assistant:

TEST(RE2, MatchNumberPeculiarity) {
  VLOG(1) << "TestMatchNumberPeculiarity";

  RE2 r("(foo)|(bar)|(baz)");
  string word1;
  string word2;
  string word3;

  CHECK(RE2::PartialMatch("foo", r, &word1, &word2, &word3));
  CHECK_EQ(word1, "foo");
  CHECK_EQ(word2, "");
  CHECK_EQ(word3, "");
  CHECK(RE2::PartialMatch("bar", r, &word1, &word2, &word3));
  CHECK_EQ(word1, "");
  CHECK_EQ(word2, "bar");
  CHECK_EQ(word3, "");
  CHECK(RE2::PartialMatch("baz", r, &word1, &word2, &word3));
  CHECK_EQ(word1, "");
  CHECK_EQ(word2, "");
  CHECK_EQ(word3, "baz");
  CHECK(!RE2::PartialMatch("f", r, &word1, &word2, &word3));

  string a;
  CHECK(RE2::FullMatch("hello", "(foo)|hello", &a));
  CHECK_EQ(a, "");
}